

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O0

wasm_trap_t * closure_callback(void *env,wasm_val_t *args,wasm_val_t *results)

{
  uint uVar1;
  int i;
  wasm_val_t *results_local;
  wasm_val_t *args_local;
  void *env_local;
  
  uVar1 = *env;
  printf("Calling back closure...\n");
  printf("> %d\n",(ulong)uVar1);
  results->kind = '\0';
  (results->of).i32 = uVar1;
  return (wasm_trap_t *)0x0;
}

Assistant:

own wasm_trap_t* closure_callback(
  void* env, const wasm_val_t args[], wasm_val_t results[]
) {
  int i = *(int*)env;
  printf("Calling back closure...\n");
  printf("> %d\n", i);

  results[0].kind = WASM_I32;
  results[0].of.i32 = (int32_t)i;
  return NULL;
}